

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_ParseCommandLineFlagsAndDashArgs_TwoDashArgMiddle::Run(void)

{
  int32 iVar1;
  char *pcVar2;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsAndDashArgs","TwoDashArgMiddle");
  iVar1 = ParseTestFlag(true,4,&PTR_anon_var_dwarf_1d5bf_00155c70);
  if (iVar1 == 7) {
    iVar1 = ParseTestFlag(false,4,&PTR_anon_var_dwarf_1d5bf_00155c70);
    if (iVar1 == 7) {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar2 = "ParseTestFlag(false, (sizeof(argv)/sizeof(*(argv))) - 1, argv)";
  }
  else {
    pcVar2 = "ParseTestFlag(true, (sizeof(argv)/sizeof(*(argv))) - 1, argv)";
  }
  fprintf(_stderr,"Check failed: %s %s %s\n","7","==",pcVar2);
  exit(1);
}

Assistant:

TEST(ParseCommandLineFlagsAndDashArgs, TwoDashArgMiddle) {
  const char* argv[] = {
    "my_test",
    "--test_flag=7",
    "--",
    "--test_flag=0",
    NULL,
  };

  EXPECT_EQ(7, ParseTestFlag(true, arraysize(argv) - 1, argv));
  EXPECT_EQ(7, ParseTestFlag(false, arraysize(argv) - 1, argv));
}